

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_0> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,float alpha)

{
  ResScalar *pRVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float *pfVar18;
  long j;
  long lVar19;
  ulong uVar20;
  float *pfVar21;
  long j_2;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long j_1;
  float *pfVar26;
  float *pfVar27;
  long lVar28;
  float *pfVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  
  lVar3 = (alhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_stride;
  lVar24 = 4;
  if ((ulong)(lVar3 * 4) < 32000) {
    lVar24 = 0x10;
  }
  if (cols < 0x80) {
    lVar24 = cols;
  }
  if (0 < cols) {
    pfVar18 = (alhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar29 = pfVar18 + 0x1c;
    lVar28 = 0;
    do {
      lVar23 = lVar24 + lVar28;
      lVar22 = cols;
      if (lVar23 < cols) {
        lVar22 = lVar23;
      }
      if (rows < 0x20) {
        uVar25 = 0;
      }
      else {
        uVar25 = 0;
        pfVar21 = pfVar29;
        do {
          fVar58 = 0.0;
          fVar59 = 0.0;
          fVar60 = 0.0;
          fVar61 = 0.0;
          fVar54 = 0.0;
          fVar55 = 0.0;
          fVar56 = 0.0;
          fVar57 = 0.0;
          fVar50 = 0.0;
          fVar51 = 0.0;
          fVar52 = 0.0;
          fVar53 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
          fVar49 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar38 = 0.0;
          fVar39 = 0.0;
          fVar40 = 0.0;
          fVar41 = 0.0;
          fVar34 = 0.0;
          fVar35 = 0.0;
          fVar36 = 0.0;
          fVar37 = 0.0;
          fVar30 = 0.0;
          fVar31 = 0.0;
          fVar32 = 0.0;
          fVar33 = 0.0;
          lVar19 = lVar28;
          pfVar26 = pfVar21;
          do {
            fVar2 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar19];
            fVar58 = fVar58 + pfVar26[-0x1c] * fVar2;
            fVar59 = fVar59 + pfVar26[-0x1b] * fVar2;
            fVar60 = fVar60 + pfVar26[-0x1a] * fVar2;
            fVar61 = fVar61 + pfVar26[-0x19] * fVar2;
            fVar54 = fVar54 + pfVar26[-0x18] * fVar2;
            fVar55 = fVar55 + pfVar26[-0x17] * fVar2;
            fVar56 = fVar56 + pfVar26[-0x16] * fVar2;
            fVar57 = fVar57 + pfVar26[-0x15] * fVar2;
            fVar50 = fVar50 + pfVar26[-0x14] * fVar2;
            fVar51 = fVar51 + pfVar26[-0x13] * fVar2;
            fVar52 = fVar52 + pfVar26[-0x12] * fVar2;
            fVar53 = fVar53 + pfVar26[-0x11] * fVar2;
            fVar46 = fVar46 + pfVar26[-0x10] * fVar2;
            fVar47 = fVar47 + pfVar26[-0xf] * fVar2;
            fVar48 = fVar48 + pfVar26[-0xe] * fVar2;
            fVar49 = fVar49 + pfVar26[-0xd] * fVar2;
            fVar42 = fVar42 + pfVar26[-0xc] * fVar2;
            fVar43 = fVar43 + pfVar26[-0xb] * fVar2;
            fVar44 = fVar44 + pfVar26[-10] * fVar2;
            fVar45 = fVar45 + pfVar26[-9] * fVar2;
            fVar38 = fVar38 + pfVar26[-8] * fVar2;
            fVar39 = fVar39 + pfVar26[-7] * fVar2;
            fVar40 = fVar40 + pfVar26[-6] * fVar2;
            fVar41 = fVar41 + pfVar26[-5] * fVar2;
            fVar34 = fVar34 + pfVar26[-4] * fVar2;
            fVar35 = fVar35 + pfVar26[-3] * fVar2;
            fVar36 = fVar36 + pfVar26[-2] * fVar2;
            fVar37 = fVar37 + pfVar26[-1] * fVar2;
            fVar30 = fVar30 + *pfVar26 * fVar2;
            fVar31 = fVar31 + pfVar26[1] * fVar2;
            fVar32 = fVar32 + pfVar26[2] * fVar2;
            fVar33 = fVar33 + pfVar26[3] * fVar2;
            lVar19 = lVar19 + 1;
            pfVar26 = pfVar26 + lVar3;
          } while (lVar19 < lVar22);
          pfVar26 = res + uVar25;
          fVar2 = pfVar26[1];
          fVar4 = pfVar26[2];
          fVar5 = pfVar26[3];
          pfVar27 = res + uVar25 + 4;
          fVar6 = *pfVar27;
          fVar7 = pfVar27[1];
          fVar8 = pfVar27[2];
          fVar9 = pfVar27[3];
          pfVar27 = res + uVar25 + 8;
          fVar10 = *pfVar27;
          fVar11 = pfVar27[1];
          fVar12 = pfVar27[2];
          fVar13 = pfVar27[3];
          pfVar27 = res + uVar25 + 0xc;
          fVar14 = *pfVar27;
          fVar15 = pfVar27[1];
          fVar16 = pfVar27[2];
          fVar17 = pfVar27[3];
          pRVar1 = res + uVar25;
          *pRVar1 = *pfVar26 + fVar58 * alpha;
          pRVar1[1] = fVar2 + fVar59 * alpha;
          pRVar1[2] = fVar4 + fVar60 * alpha;
          pRVar1[3] = fVar5 + fVar61 * alpha;
          pRVar1 = res + uVar25 + 4;
          *pRVar1 = fVar54 * alpha + fVar6;
          pRVar1[1] = fVar55 * alpha + fVar7;
          pRVar1[2] = fVar56 * alpha + fVar8;
          pRVar1[3] = fVar57 * alpha + fVar9;
          pRVar1 = res + uVar25 + 8;
          *pRVar1 = fVar50 * alpha + fVar10;
          pRVar1[1] = fVar51 * alpha + fVar11;
          pRVar1[2] = fVar52 * alpha + fVar12;
          pRVar1[3] = fVar53 * alpha + fVar13;
          pRVar1 = res + uVar25 + 0xc;
          *pRVar1 = fVar46 * alpha + fVar14;
          pRVar1[1] = fVar47 * alpha + fVar15;
          pRVar1[2] = fVar48 * alpha + fVar16;
          pRVar1[3] = fVar49 * alpha + fVar17;
          pfVar26 = res + uVar25 + 0x10;
          fVar46 = pfVar26[1];
          fVar47 = pfVar26[2];
          fVar48 = pfVar26[3];
          pRVar1 = res + uVar25 + 0x10;
          *pRVar1 = fVar42 * alpha + *pfVar26;
          pRVar1[1] = fVar43 * alpha + fVar46;
          pRVar1[2] = fVar44 * alpha + fVar47;
          pRVar1[3] = fVar45 * alpha + fVar48;
          pfVar26 = res + uVar25 + 0x14;
          fVar42 = pfVar26[1];
          fVar43 = pfVar26[2];
          fVar44 = pfVar26[3];
          pRVar1 = res + uVar25 + 0x14;
          *pRVar1 = fVar38 * alpha + *pfVar26;
          pRVar1[1] = fVar39 * alpha + fVar42;
          pRVar1[2] = fVar40 * alpha + fVar43;
          pRVar1[3] = fVar41 * alpha + fVar44;
          pfVar26 = res + uVar25 + 0x18;
          fVar38 = pfVar26[1];
          fVar39 = pfVar26[2];
          fVar40 = pfVar26[3];
          pRVar1 = res + uVar25 + 0x18;
          *pRVar1 = fVar34 * alpha + *pfVar26;
          pRVar1[1] = fVar35 * alpha + fVar38;
          pRVar1[2] = fVar36 * alpha + fVar39;
          pRVar1[3] = fVar37 * alpha + fVar40;
          pfVar26 = res + uVar25 + 0x1c;
          fVar34 = pfVar26[1];
          fVar35 = pfVar26[2];
          fVar36 = pfVar26[3];
          pRVar1 = res + uVar25 + 0x1c;
          *pRVar1 = fVar30 * alpha + *pfVar26;
          pRVar1[1] = fVar31 * alpha + fVar34;
          pRVar1[2] = fVar32 * alpha + fVar35;
          pRVar1[3] = fVar33 * alpha + fVar36;
          uVar25 = uVar25 + 0x20;
          pfVar21 = pfVar21 + 0x20;
        } while ((long)uVar25 < rows + -0x1f);
      }
      if ((long)uVar25 < rows + -0xf) {
        pfVar21 = pfVar18 + uVar25;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        lVar19 = lVar28;
        do {
          fVar46 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar19];
          fVar42 = fVar42 + *pfVar21 * fVar46;
          fVar43 = fVar43 + pfVar21[1] * fVar46;
          fVar44 = fVar44 + pfVar21[2] * fVar46;
          fVar45 = fVar45 + pfVar21[3] * fVar46;
          fVar38 = fVar38 + pfVar21[4] * fVar46;
          fVar39 = fVar39 + pfVar21[5] * fVar46;
          fVar40 = fVar40 + pfVar21[6] * fVar46;
          fVar41 = fVar41 + pfVar21[7] * fVar46;
          fVar34 = fVar34 + pfVar21[8] * fVar46;
          fVar35 = fVar35 + pfVar21[9] * fVar46;
          fVar36 = fVar36 + pfVar21[10] * fVar46;
          fVar37 = fVar37 + pfVar21[0xb] * fVar46;
          fVar30 = fVar30 + pfVar21[0xc] * fVar46;
          fVar31 = fVar31 + pfVar21[0xd] * fVar46;
          fVar32 = fVar32 + pfVar21[0xe] * fVar46;
          fVar33 = fVar33 + pfVar21[0xf] * fVar46;
          lVar19 = lVar19 + 1;
          pfVar21 = pfVar21 + lVar3;
        } while (lVar19 < lVar22);
        pfVar21 = res + uVar25;
        fVar46 = pfVar21[1];
        fVar47 = pfVar21[2];
        fVar48 = pfVar21[3];
        pfVar26 = res + uVar25 + 4;
        fVar49 = *pfVar26;
        fVar50 = pfVar26[1];
        fVar51 = pfVar26[2];
        fVar52 = pfVar26[3];
        pfVar26 = res + uVar25 + 8;
        fVar53 = *pfVar26;
        fVar54 = pfVar26[1];
        fVar55 = pfVar26[2];
        fVar56 = pfVar26[3];
        pfVar26 = res + uVar25 + 0xc;
        fVar57 = *pfVar26;
        fVar58 = pfVar26[1];
        fVar59 = pfVar26[2];
        fVar60 = pfVar26[3];
        pRVar1 = res + uVar25;
        *pRVar1 = *pfVar21 + fVar42 * alpha;
        pRVar1[1] = fVar46 + fVar43 * alpha;
        pRVar1[2] = fVar47 + fVar44 * alpha;
        pRVar1[3] = fVar48 + fVar45 * alpha;
        pRVar1 = res + uVar25 + 4;
        *pRVar1 = fVar38 * alpha + fVar49;
        pRVar1[1] = fVar39 * alpha + fVar50;
        pRVar1[2] = fVar40 * alpha + fVar51;
        pRVar1[3] = fVar41 * alpha + fVar52;
        pRVar1 = res + uVar25 + 8;
        *pRVar1 = fVar34 * alpha + fVar53;
        pRVar1[1] = fVar35 * alpha + fVar54;
        pRVar1[2] = fVar36 * alpha + fVar55;
        pRVar1[3] = fVar37 * alpha + fVar56;
        pRVar1 = res + uVar25 + 0xc;
        *pRVar1 = fVar30 * alpha + fVar57;
        pRVar1[1] = fVar31 * alpha + fVar58;
        pRVar1[2] = fVar32 * alpha + fVar59;
        pRVar1[3] = fVar33 * alpha + fVar60;
        uVar25 = uVar25 | 0x10;
      }
      if ((long)uVar25 < rows + -0xb) {
        pfVar21 = pfVar18 + uVar25;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        lVar19 = lVar28;
        do {
          fVar42 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar19];
          fVar38 = fVar38 + *pfVar21 * fVar42;
          fVar39 = fVar39 + pfVar21[1] * fVar42;
          fVar40 = fVar40 + pfVar21[2] * fVar42;
          fVar41 = fVar41 + pfVar21[3] * fVar42;
          fVar34 = fVar34 + pfVar21[4] * fVar42;
          fVar35 = fVar35 + pfVar21[5] * fVar42;
          fVar36 = fVar36 + pfVar21[6] * fVar42;
          fVar37 = fVar37 + pfVar21[7] * fVar42;
          fVar30 = fVar30 + pfVar21[8] * fVar42;
          fVar31 = fVar31 + pfVar21[9] * fVar42;
          fVar32 = fVar32 + pfVar21[10] * fVar42;
          fVar33 = fVar33 + pfVar21[0xb] * fVar42;
          lVar19 = lVar19 + 1;
          pfVar21 = pfVar21 + lVar3;
        } while (lVar19 < lVar22);
        pfVar21 = res + uVar25;
        fVar42 = pfVar21[1];
        fVar43 = pfVar21[2];
        fVar44 = pfVar21[3];
        pfVar26 = res + uVar25 + 4;
        fVar45 = *pfVar26;
        fVar46 = pfVar26[1];
        fVar47 = pfVar26[2];
        fVar48 = pfVar26[3];
        pfVar26 = res + uVar25 + 8;
        fVar49 = *pfVar26;
        fVar50 = pfVar26[1];
        fVar51 = pfVar26[2];
        fVar52 = pfVar26[3];
        pRVar1 = res + uVar25;
        *pRVar1 = *pfVar21 + fVar38 * alpha;
        pRVar1[1] = fVar42 + fVar39 * alpha;
        pRVar1[2] = fVar43 + fVar40 * alpha;
        pRVar1[3] = fVar44 + fVar41 * alpha;
        pRVar1 = res + uVar25 + 4;
        *pRVar1 = fVar34 * alpha + fVar45;
        pRVar1[1] = fVar35 * alpha + fVar46;
        pRVar1[2] = fVar36 * alpha + fVar47;
        pRVar1[3] = fVar37 * alpha + fVar48;
        pRVar1 = res + uVar25 + 8;
        *pRVar1 = fVar30 * alpha + fVar49;
        pRVar1[1] = fVar31 * alpha + fVar50;
        pRVar1[2] = fVar32 * alpha + fVar51;
        pRVar1[3] = fVar33 * alpha + fVar52;
        uVar25 = uVar25 + 0xc;
      }
      if ((long)uVar25 < rows + -7) {
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        uVar20 = uVar25;
        lVar19 = lVar28;
        do {
          fVar38 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar19];
          pfVar21 = pfVar18 + uVar20;
          pfVar26 = pfVar18 + uVar20 + 4;
          fVar34 = fVar34 + *pfVar21 * fVar38;
          fVar35 = fVar35 + pfVar21[1] * fVar38;
          fVar36 = fVar36 + pfVar21[2] * fVar38;
          fVar37 = fVar37 + pfVar21[3] * fVar38;
          fVar30 = fVar30 + *pfVar26 * fVar38;
          fVar31 = fVar31 + pfVar26[1] * fVar38;
          fVar32 = fVar32 + pfVar26[2] * fVar38;
          fVar33 = fVar33 + pfVar26[3] * fVar38;
          lVar19 = lVar19 + 1;
          uVar20 = uVar20 + lVar3;
        } while (lVar19 < lVar22);
        pfVar21 = res + uVar25;
        fVar38 = pfVar21[1];
        fVar39 = pfVar21[2];
        fVar40 = pfVar21[3];
        pfVar26 = res + uVar25 + 4;
        fVar41 = *pfVar26;
        fVar42 = pfVar26[1];
        fVar43 = pfVar26[2];
        fVar44 = pfVar26[3];
        pRVar1 = res + uVar25;
        *pRVar1 = *pfVar21 + fVar34 * alpha;
        pRVar1[1] = fVar38 + fVar35 * alpha;
        pRVar1[2] = fVar39 + fVar36 * alpha;
        pRVar1[3] = fVar40 + fVar37 * alpha;
        pRVar1 = res + uVar25 + 4;
        *pRVar1 = fVar30 * alpha + fVar41;
        pRVar1[1] = fVar31 * alpha + fVar42;
        pRVar1[2] = fVar32 * alpha + fVar43;
        pRVar1[3] = fVar33 * alpha + fVar44;
        uVar25 = uVar25 + 8;
      }
      if ((long)uVar25 < rows + -3) {
        pfVar21 = pfVar18 + uVar25;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        lVar19 = lVar28;
        do {
          fVar34 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar19];
          fVar30 = fVar30 + *pfVar21 * fVar34;
          fVar31 = fVar31 + pfVar21[1] * fVar34;
          fVar32 = fVar32 + pfVar21[2] * fVar34;
          fVar33 = fVar33 + pfVar21[3] * fVar34;
          lVar19 = lVar19 + 1;
          pfVar21 = pfVar21 + lVar3;
        } while (lVar19 < lVar22);
        pfVar21 = res + uVar25;
        fVar34 = pfVar21[1];
        fVar35 = pfVar21[2];
        fVar36 = pfVar21[3];
        pRVar1 = res + uVar25;
        *pRVar1 = fVar30 * alpha + *pfVar21;
        pRVar1[1] = fVar31 * alpha + fVar34;
        pRVar1[2] = fVar32 * alpha + fVar35;
        pRVar1[3] = fVar33 * alpha + fVar36;
        uVar25 = uVar25 + 4;
      }
      if ((long)uVar25 < rows) {
        pfVar26 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
        pfVar21 = pfVar18 + uVar25;
        do {
          fVar30 = 0.0;
          lVar19 = lVar28;
          pfVar27 = pfVar21;
          do {
            fVar30 = fVar30 + *pfVar27 * pfVar26[lVar19];
            lVar19 = lVar19 + 1;
            pfVar27 = pfVar27 + lVar3;
          } while (lVar19 < lVar22);
          res[uVar25] = fVar30 * alpha + res[uVar25];
          uVar25 = uVar25 + 1;
          pfVar21 = pfVar21 + 1;
        } while (uVar25 != rows);
      }
      pfVar29 = pfVar29 + lVar24 * lVar3;
      pfVar18 = pfVar18 + lVar24 * lVar3;
      lVar28 = lVar23;
    } while (lVar23 < cols);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}